

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomicsObject.cpp
# Opt level: O0

Var Js::AtomicsObject::EntryNotify(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  CallFlags e;
  BOOL BVar4;
  uint32 uVar5;
  uint index;
  uint uVar6;
  ScriptContext *pSVar7;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar8;
  Var pvVar9;
  Var index_00;
  int *piVar10;
  ArrayBufferBase *pAVar11;
  undefined4 extraout_var;
  WaiterList *this_00;
  CriticalSection *cs;
  AutoCriticalSection local_98;
  AutoCriticalSection autoCS;
  uint32 removed;
  WaiterList *waiterList;
  SharedArrayBuffer *sharedArrayBuffer;
  int local_70;
  uint32 bufferIndex;
  double dStack_68;
  int32 c;
  double d;
  TypedArrayBase *pTStack_58;
  int32 count;
  TypedArrayBase *typedArrayBase;
  ScriptContext *pSStack_48;
  uint32 accessIndex;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar7 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar7);
  pSVar7 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar7,(PVOID)0x0);
  iVar3 = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,iVar3);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/AtomicsObject.cpp"
                                ,0xed,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  pSStack_48 = RecyclableObject::GetScriptContext(function);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/AtomicsObject.cpp"
                                ,0xed,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  if (2 < ((uint)scriptContext & 0xffffff)) {
    typedArrayBase._4_4_ = 0;
    pvVar9 = Arguments::operator[]((Arguments *)&scriptContext,1);
    index_00 = Arguments::operator[]((Arguments *)&scriptContext,2);
    pTStack_58 = ValidateAndGetTypedArray
                           (pvVar9,index_00,(uint32 *)((long)&typedArrayBase + 4),pSStack_48,true);
    d._4_4_ = 0x7fffffff;
    if (3 < ((uint)scriptContext & 0xffffff)) {
      pvVar9 = Arguments::operator[]((Arguments *)&scriptContext,3);
      BVar4 = Js::JavascriptOperators::IsUndefinedObject(pvVar9);
      if (BVar4 == 0) {
        pvVar9 = Arguments::operator[]((Arguments *)&scriptContext,3);
        dStack_68 = JavascriptConversion::ToInteger(pvVar9,pSStack_48);
        bVar2 = NumberUtilities::IsNan(dStack_68);
        if ((!bVar2) && (bVar2 = JavascriptNumber::IsPosInf(dStack_68), !bVar2)) {
          bufferIndex = JavascriptConversion::ToInt32(dStack_68);
          local_70 = 0;
          piVar10 = max<int>(&local_70,(int *)&bufferIndex);
          d._4_4_ = *piVar10;
        }
      }
    }
    uVar5 = Js::TypedArrayBase::GetBytesPerElement(pTStack_58);
    if (uVar5 != 4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/AtomicsObject.cpp"
                                  ,0xfc,"(typedArrayBase->GetBytesPerElement() == 4)",
                                  "typedArrayBase->GetBytesPerElement() == 4");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    iVar3 = typedArrayBase._4_4_ * 4;
    uVar5 = Js::TypedArrayBase::GetByteOffset(pTStack_58);
    index = iVar3 + uVar5;
    pAVar11 = ArrayBufferParent::GetArrayBuffer(&pTStack_58->super_ArrayBufferParent);
    uVar6 = (*(pAVar11->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])();
    if (uVar6 <= index) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/AtomicsObject.cpp"
                                  ,0xfe,
                                  "(bufferIndex < typedArrayBase->GetArrayBuffer()->GetByteLength())"
                                  ,"bufferIndex < typedArrayBase->GetArrayBuffer()->GetByteLength()"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    pAVar11 = ArrayBufferParent::GetArrayBuffer(&pTStack_58->super_ArrayBufferParent);
    iVar3 = (*(pAVar11->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6f])();
    this_00 = SharedArrayBuffer::GetWaiterList
                        ((SharedArrayBuffer *)CONCAT44(extraout_var,iVar3),index);
    autoCS.cs._4_4_ = 0;
    cs = WaiterList::GetCriticalSectionForAccess(this_00);
    AutoCriticalSection::AutoCriticalSection(&local_98,cs);
    autoCS.cs._4_4_ = WaiterList::RemoveAndWakeWaiters(this_00,d._4_4_);
    AutoCriticalSection::~AutoCriticalSection(&local_98);
    pvVar9 = JavascriptNumber::ToVar(autoCS.cs._4_4_,pSStack_48);
    return pvVar9;
  }
  JavascriptError::ThrowRangeError(pSStack_48,-0x7ff5ec12,L"Atomics.notify");
}

Assistant:

Var AtomicsObject::EntryNotify(RecyclableObject* function, CallInfo callInfo, ...)
    {
        ATOMICS_FUNCTION_ENTRY_CHECKS(2, "Atomics.notify");

        uint32 accessIndex = 0;
        TypedArrayBase *typedArrayBase = ValidateAndGetTypedArray(args[1], args[2], &accessIndex, scriptContext, true /*onlyInt32*/);
        int32 count = INT_MAX;
        if (args.Info.Count > 3 && !JavascriptOperators::IsUndefinedObject(args[3]))
        {
            double d = JavascriptConversion::ToInteger(args[3], scriptContext);
            if (!(NumberUtilities::IsNan(d) || JavascriptNumber::IsPosInf(d)))
            {
                int32 c = JavascriptConversion::ToInt32(d);
                count = max(0, c);
            }
        }

        Assert(typedArrayBase->GetBytesPerElement() == 4);
        uint32 bufferIndex = (accessIndex * 4) + typedArrayBase->GetByteOffset();
        Assert(bufferIndex < typedArrayBase->GetArrayBuffer()->GetByteLength());
        SharedArrayBuffer *sharedArrayBuffer = typedArrayBase->GetArrayBuffer()->GetAsSharedArrayBuffer();
        WaiterList *waiterList = sharedArrayBuffer->GetWaiterList(bufferIndex);

        uint32 removed = 0;
        {
            AutoCriticalSection autoCS(waiterList->GetCriticalSectionForAccess());
            removed = waiterList->RemoveAndWakeWaiters(count);
        }

        return JavascriptNumber::ToVar(removed, scriptContext);
    }